

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O1

int __thiscall MeshLib::List<char>::remove(List<char> *this,char *__filename)

{
  int extraout_EAX;
  ListNode<char> *pLVar1;
  ListNode<char> *extraout_RAX;
  ListNode<char> *pLVar2;
  
  pLVar2 = this->m_head;
  if (pLVar2 != (ListNode<char> *)__filename) {
    do {
      pLVar1 = pLVar2;
      pLVar2 = pLVar1->m_next;
    } while (pLVar2 != (ListNode<char> *)__filename);
    pLVar1->m_next = *(ListNode<char> **)(__filename + 8);
    this->m_size = this->m_size + -1;
    operator_delete(__filename);
    return extraout_EAX;
  }
  pLVar2 = pLVar2->m_next;
  this->m_head = pLVar2;
  if (__filename != (char *)0x0) {
    operator_delete(__filename);
    pLVar2 = extraout_RAX;
  }
  this->m_size = this->m_size + -1;
  return (int)pLVar2;
}

Assistant:

void List<T>::remove( ListNode<T> * tn )
{

	if( tn == m_head )
	{
		m_head = m_head->next();
		delete tn;
		m_size --;
		return;
	}

	ListNode<T> * n;
	n = m_head;

	while( n->next() != tn )
	{
		n = n->next();
	}


	if( n != NULL )
	{
		n->next() = tn->next();
		m_size --;
		delete tn;
	}
}